

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::ParseNamespace(Parser *this)

{
  pointer *pppNVar1;
  iterator __position;
  Namespace *pNVar2;
  CheckedError *ce;
  Parser *in_RSI;
  Namespace *ns;
  Namespace *local_20;
  
  Next(this);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    local_20 = (Namespace *)operator_new(0x20);
    (local_20->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_20->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_20->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_20->from_table = 0;
    __position._M_current =
         (in_RSI->namespaces_).
         super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (in_RSI->namespaces_).
        super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<flatbuffers::Namespace*,std::allocator<flatbuffers::Namespace*>>::
      _M_realloc_insert<flatbuffers::Namespace*const&>
                ((vector<flatbuffers::Namespace*,std::allocator<flatbuffers::Namespace*>> *)
                 &in_RSI->namespaces_,__position,&local_20);
    }
    else {
      *__position._M_current = local_20;
      pppNVar1 = &(in_RSI->namespaces_).
                  super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
    if ((in_RSI->super_ParserState).token_ == 0x3b) {
LAB_00129d97:
      pppNVar1 = &(in_RSI->namespaces_).
                  super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + -1;
      pNVar2 = UniqueNamespace(in_RSI,local_20);
      in_RSI->current_namespace_ = pNVar2;
      Expect(this,(int)in_RSI);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
      }
    }
    else {
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_20->components,&(in_RSI->super_ParserState).attribute_);
        Expect(this,(int)in_RSI);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
        if ((in_RSI->super_ParserState).token_ != 0x2e) goto LAB_00129d97;
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      } while (*(char *)&(this->super_ParserState).prev_cursor_ == '\0');
    }
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseNamespace() {
  NEXT();
  auto ns = new Namespace();
  namespaces_.push_back(ns);  // Store it here to not leak upon error.
  if (token_ != ';') {
    for (;;) {
      ns->components.push_back(attribute_);
      EXPECT(kTokenIdentifier);
      if (Is('.')) NEXT() else break;
    }
  }
  namespaces_.pop_back();
  current_namespace_ = UniqueNamespace(ns);
  EXPECT(';');
  return NoError();
}